

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O2

string * setup::filename_map::shorten_path(string *__return_storage_ptr__,string *path)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  char *pcVar7;
  it s_begin;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  _Var6._M_current = (path->_M_dataplus)._M_p;
  pcVar7 = _Var6._M_current + path->_M_string_length;
LAB_00130ec1:
  do {
    __first._M_current = _Var6._M_current;
    if (__first._M_current == pcVar7) {
      return __return_storage_ptr__;
    }
    lVar2 = 0;
    lVar1 = 0;
    for (lVar3 = (long)pcVar7 - (long)__first._M_current >> 2; _Var6._M_current = pcVar7, 0 < lVar3;
        lVar3 = lVar3 + -1) {
      if ((__first._M_current[lVar2 * 4] == '/') || (__first._M_current[lVar2 * 4] == '\\')) {
        pcVar4 = __first._M_current + -lVar1;
        goto LAB_00130f5b;
      }
      if ((__first._M_current[lVar2 * 4 + 1] == '/') || (__first._M_current[lVar2 * 4 + 1] == '\\'))
      {
        pcVar4 = __first._M_current + (1 - lVar1);
        goto LAB_00130f5b;
      }
      if ((__first._M_current[lVar2 * 4 + 2] == '/') || (__first._M_current[lVar2 * 4 + 2] == '\\'))
      {
        pcVar4 = __first._M_current + (2 - lVar1);
        goto LAB_00130f5b;
      }
      if ((__first._M_current[lVar2 * 4 + 3] == '/') || (__first._M_current[lVar2 * 4 + 3] == '\\'))
      {
        pcVar4 = __first._M_current + (3 - lVar1);
        goto LAB_00130f5b;
      }
      lVar1 = lVar1 + -4;
      lVar2 = lVar2 + 1;
    }
    pcVar4 = __first._M_current + -lVar1;
    lVar3 = ((long)pcVar7 - (long)__first._M_current) + lVar1;
    _Var5._M_current = pcVar7;
    if (lVar3 == 1) {
LAB_00131038:
      if ((*pcVar4 == '/') || (*pcVar4 == '\\')) goto LAB_00130f5b;
    }
    else {
      if (lVar3 == 3) {
        if ((__first._M_current[lVar2 * 4] != '/') && (__first._M_current[lVar2 * 4] != '\\')) {
          pcVar4 = __first._M_current + (1 - lVar1);
          goto LAB_0013101e;
        }
      }
      else {
        if (lVar3 != 2) goto LAB_00130f67;
LAB_0013101e:
        if ((*pcVar4 != '/') && (*pcVar4 != '\\')) {
          pcVar4 = pcVar4 + 1;
          goto LAB_00131038;
        }
      }
LAB_00130f5b:
      _Var5._M_current = pcVar4;
      _Var6._M_current = pcVar4 + 1;
      if (pcVar4 == pcVar7) {
        _Var6._M_current = pcVar7;
      }
    }
LAB_00130f67:
  } while (_Var5._M_current == __first._M_current);
  if ((long)_Var5._M_current - (long)__first._M_current == 1) {
    if (*__first._M_current == '.') goto LAB_00130ec1;
  }
  else if ((((long)_Var5._M_current - (long)__first._M_current == 2) && (*__first._M_current == '.')
           ) && (__first._M_current[1] == '.')) {
    std::__cxx11::string::rfind((char)__return_storage_ptr__,0x2f);
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    goto LAB_00130ec1;
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::__cxx11::string::append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((string *)__return_storage_ptr__,__first,_Var5);
  goto LAB_00130ec1;
}

Assistant:

std::string filename_map::shorten_path(const std::string & path) {
	
	std::string result;
	result.reserve(path.size());
	
	it begin = path.begin();
	it end = path.end();
	while(begin != end) {
		
		it s_begin = begin;
		it s_end = std::find_if(begin, end, is_path_separator());
		begin = (s_end == end) ? end : (s_end + 1);
		
		size_t segment_length = size_t(s_end - s_begin);
		
		// Empty segment - ignore
		if(segment_length == 0) {
			continue;
		}
		
		// '.' segment - ignore
		if(segment_length == 1 && *s_begin == '.') {
			continue;
		}
		
		// '..' segment - backtrace in result path
		if(segment_length == 2 && *s_begin == '.' && *(s_begin + 1) == '.') {
			size_t last_sep = result.find_last_of(path_sep);
			if(last_sep == std::string::npos) {
				last_sep = 0;
			}
			result.resize(last_sep);
			continue;
		}
		
		// Normal segment - append to the result path
		if(!result.empty()) {
			result.push_back(path_sep);
		}
		result.append(s_begin, s_end);
		
	}
	
	return result;
}